

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O3

IceTBoolean icetIsEnabled(IceTEnum pname)

{
  IceTBoolean isEnabled;
  IceTBoolean local_9;
  
  if (pname - 0x180 < 0xffffffc0) {
    icetRaiseDiagnostic("Bad value to icetIsEnabled",0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                        ,0x1a3);
    local_9 = '\0';
  }
  else {
    icetGetBooleanv(pname,&local_9);
  }
  return local_9;
}

Assistant:

IceTBoolean icetIsEnabled(IceTEnum pname)
{
    IceTBoolean isEnabled;

    if ((pname < ICET_STATE_ENABLE_START) || (pname >= ICET_STATE_ENABLE_END)) {
        icetRaiseError("Bad value to icetIsEnabled", ICET_INVALID_VALUE);
        return ICET_FALSE;
    }
    icetGetBooleanv(pname, &isEnabled);
    return isEnabled;
}